

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

void __thiscall
CLIntercept::getObjectListString<_cl_semaphore_khr*>
          (CLIntercept *this,cl_uint numObjects,_cl_semaphore_khr **objectList,string *str)

{
  string *in_RCX;
  long in_RDX;
  uint in_ESI;
  cl_uint i;
  char s [256];
  uint local_12c;
  char local_128 [264];
  string *local_20;
  long local_18;
  uint local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  snprintf(local_128,0x100,"( size = %u )[ ",(ulong)in_ESI);
  std::__cxx11::string::operator+=(local_20,local_128);
  if (local_18 != 0) {
    for (local_12c = 0; local_12c < local_c; local_12c = local_12c + 1) {
      if (local_12c != 0) {
        std::__cxx11::string::operator+=(local_20,", ");
      }
      snprintf(local_128,0x100,"%p",*(undefined8 *)(local_18 + (ulong)local_12c * 8));
      std::__cxx11::string::operator+=(local_20,local_128);
    }
  }
  std::__cxx11::string::operator+=(local_20," ]");
  return;
}

Assistant:

void CLIntercept::getObjectListString(
    cl_uint numObjects,
    const T* objectList,
    std::string& str ) const
{
    char    s[256];
    CLI_SPRINTF(s, 256, "( size = %u )[ ", numObjects);
    str += s;

    if( objectList )
    {
        for( cl_uint i = 0; i < numObjects; i++ )
        {
            if( i > 0 )
            {
                str += ", ";
            }
            CLI_SPRINTF( s, 256, "%p", objectList[i] );
            str += s;
        }
    }
    str += " ]";
}